

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O2

int onmt::unicode::get_script(code_point_t c,int previous_script)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  UErrorCode error;
  UScriptCode extensions [198];
  undefined4 local_32c;
  int local_328 [198];
  
  for (lVar4 = compat_scripts; lVar4 != DAT_003c08d8; lVar4 = lVar4 + 0x18) {
    if ((*(int *)(lVar4 + 0x10) <= c) && (c <= *(int *)(lVar4 + 0x14))) {
      return *(int *)(lVar4 + 8);
    }
  }
  local_32c = 0;
  iVar2 = uscript_getScript_70(c);
  iVar7 = previous_script;
  if ((iVar2 != 1) && (iVar7 = iVar2, iVar2 == 0)) {
    uVar3 = uscript_getScriptExtensions_70(c,local_328,0xc6,&local_32c);
    uVar5 = 0;
    uVar1 = 0;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)uVar3;
    }
    do {
      uVar6 = uVar1;
      if (uVar5 == uVar6) break;
      uVar1 = uVar6 + 1;
    } while (local_328[uVar6] != previous_script);
    iVar7 = previous_script;
    if ((long)(int)uVar3 <= (long)uVar6) {
      iVar7 = local_328[0];
    }
  }
  return iVar7;
}

Assistant:

int get_script(code_point_t c, int previous_script)
    {
      for (const auto& pair : compat_scripts)
      {
        const auto& range = pair.second;
        if (c >= range.first && c <= range.second)
          return pair.first.second;
      }

      UErrorCode error = U_ZERO_ERROR;
      UScriptCode code = uscript_getScript(c, &error);

      switch (code)
      {
      case USCRIPT_INHERITED:
        return previous_script;
      case USCRIPT_COMMON:
      {
        // For common characters, we return previous_script if it is included in
        // their script extensions.
        UScriptCode extensions[USCRIPT_CODE_LIMIT];
        int num_extensions = uscript_getScriptExtensions(c, extensions, USCRIPT_CODE_LIMIT, &error);
        for (int i = 0; i < num_extensions; ++i)
        {
          if (extensions[i] == previous_script)
            return previous_script;
        }
        return extensions[0];
      }
      default:
        return code;
      }
    }